

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5IndexPrepareStmt(Fts5Index *p,sqlite3_stmt **ppStmt,char *zSql)

{
  int iVar1;
  
  if (p->rc == 0) {
    if (zSql == (char *)0x0) {
      iVar1 = 7;
    }
    else {
      iVar1 = sqlite3LockAndPrepare(p->pConfig->db,zSql,-1,0x85,(Vdbe *)0x0,ppStmt,(char **)0x0);
    }
    p->rc = iVar1;
  }
  sqlite3_free(zSql);
  return p->rc;
}

Assistant:

static int fts5IndexPrepareStmt(
  Fts5Index *p,
  sqlite3_stmt **ppStmt,
  char *zSql
){
  if( p->rc==SQLITE_OK ){
    if( zSql ){
      p->rc = sqlite3_prepare_v3(p->pConfig->db, zSql, -1,
          SQLITE_PREPARE_PERSISTENT|SQLITE_PREPARE_NO_VTAB,
          ppStmt, 0);
    }else{
      p->rc = SQLITE_NOMEM;
    }
  }
  sqlite3_free(zSql);
  return p->rc;
}